

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O0

void __thiscall doctest::detail::Subcase::~Subcase(Subcase *this)

{
  ContextState *pCVar1;
  ContextState **ppCVar2;
  size_type sVar3;
  ContextState *s;
  Subcase *this_local;
  
  if ((this->m_entered & 1U) != 0) {
    ppCVar2 = getContextState();
    pCVar1 = *ppCVar2;
    pCVar1->subcasesCurrentLevel = pCVar1->subcasesCurrentLevel + -1;
    if ((pCVar1->subcasesHasSkipped & 1U) == 0) {
      std::
      set<doctest::detail::SubcaseSignature,_std::less<doctest::detail::SubcaseSignature>,_std::allocator<doctest::detail::SubcaseSignature>_>
      ::insert(&pCVar1->subcasesPassed,&this->m_signature);
    }
    sVar3 = std::vector<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>::size
                      (&pCVar1->subcasesStack);
    if (sVar3 != 0) {
      std::vector<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>::pop_back
                (&pCVar1->subcasesStack);
    }
    if (((pCVar1->super_TestAccessibleContextState).hasLoggedCurrentTestStart & 1U) != 0) {
      logTestEnd();
    }
    (pCVar1->super_TestAccessibleContextState).hasLoggedCurrentTestStart = false;
  }
  return;
}

Assistant:

Subcase::~Subcase() {
        if(m_entered) {
            ContextState* s = getContextState();

            s->subcasesCurrentLevel--;
            // only mark the subcase as passed if no subcases have been skipped
            if(s->subcasesHasSkipped == false)
                s->subcasesPassed.insert(m_signature);

            if(s->subcasesStack.size() > 0)
                s->subcasesStack.pop_back();
            if(s->hasLoggedCurrentTestStart)
                logTestEnd();
            s->hasLoggedCurrentTestStart = false;
        }
    }